

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intermission.cpp
# Opt level: O3

bool __thiscall DIntermissionScreen::CheckOverlay(DIntermissionScreen *this,int i)

{
  int iVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  PClass *pPVar4;
  bool bVar5;
  FName local_14;
  
  iVar1 = (this->mOverlays).Array[i].mCondition.Index;
  bVar5 = true;
  if (iVar1 != 0) {
    if ((iVar1 != 0x236) || (multiplayer)) {
      if (multiplayer) {
        return false;
      }
      if (players == (undefined8 *)0x0) {
        return false;
      }
      pPVar3 = PClass::FindClass(&local_14);
      puVar2 = players;
      if (pPVar3 != (PClass *)0x0) {
        pPVar4 = (PClass *)players[1];
        if (pPVar4 == (PClass *)0x0) {
          pPVar4 = (PClass *)(**(code **)*players)(players);
          puVar2[1] = pPVar4;
        }
        bVar5 = pPVar4 != (PClass *)0x0;
        if (pPVar4 != pPVar3 && bVar5) {
          do {
            pPVar4 = pPVar4->ParentClass;
            bVar5 = pPVar4 != (PClass *)0x0;
            if (pPVar4 == pPVar3) break;
          } while (pPVar4 != (PClass *)0x0);
        }
        if (bVar5) {
          return true;
        }
      }
    }
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool DIntermissionScreen::CheckOverlay(int i)
{
	if (mOverlays[i].mCondition == NAME_Multiplayer && !multiplayer) return false;
	else if (mOverlays[i].mCondition != NAME_None)
	{
		if (multiplayer || players[0].mo == NULL) return false;
		const PClass *cls = PClass::FindClass(mOverlays[i].mCondition);
		if (cls == NULL) return false;
		if (!players[0].mo->IsKindOf(cls)) return false;
	}
	return true;
}